

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O0

int phits2mcpl_app(int argc,char **argv)

{
  int iVar1;
  int *in_RSI;
  undefined4 in_EDI;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_00000018;
  int ok;
  int do_gzip;
  int double_prec;
  char *dumphdrfile;
  char *cfgfile;
  char *outfile;
  char *infile;
  char **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char **in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  
  phits2mcpl_parse_args
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,
             (char **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,in_RSI,(int *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  iVar1 = phits2mcpl2(dumphdrfile,_do_gzip,ok,in_stack_00000018,in_stack_00000010,in_stack_00000008)
  ;
  return (uint)(iVar1 == 0);
}

Assistant:

int phits2mcpl_app(int argc,char** argv)
{
  const char * infile;
  const char * outfile;
  const char * cfgfile;
  const char * dumphdrfile;
  int double_prec, do_gzip;
  phits2mcpl_parse_args(argc,argv,&infile,&outfile,&cfgfile,&dumphdrfile,&double_prec,&do_gzip);
  int ok = phits2mcpl2(infile, outfile,double_prec, do_gzip,cfgfile,dumphdrfile);
  return ok ? 0 : 1;
}